

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O1

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  byte *pbVar5;
  int iVar6;
  char *pcVar7;
  uint uVar8;
  uint *puVar10;
  long lVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  unsigned_short *in_R8;
  char *pcVar12;
  char **ppcVar13;
  uint uVar9;
  
  if (ptr == end) {
    return -4;
  }
  puVar10 = &switchD_004cebd9::switchdataD_005c3c38;
  pcVar7 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    ppcVar13 = (char **)(ptr + 1);
    if (ppcVar13 == (char **)end) {
      return -1;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13)) {
    case 5:
      if ((long)end - (long)ppcVar13 < 2) {
        return -2;
      }
      iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
      lVar11 = 3;
      pcVar7 = extraout_RDX_07;
      break;
    case 6:
      if ((long)(end + -(long)ppcVar13) < 3) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,end,(char **)(end + -(long)ppcVar13));
      lVar11 = 4;
      pcVar7 = extraout_RDX_06;
      break;
    case 7:
      if ((long)(end + -(long)ppcVar13) < 4) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,end,(char **)(end + -(long)ppcVar13));
      lVar11 = 5;
      pcVar7 = extraout_RDX_05;
      break;
    default:
      goto switchD_004ced51_caseD_8;
    case 0xf:
      iVar6 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar6;
    case 0x10:
      pbVar1 = (byte *)(ptr + 2);
      if (pbVar1 == (byte *)end) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar1);
      if (cVar2 != '\x14') {
        if (cVar2 != '\x1b') {
          *nextTokPtr = (char *)pbVar1;
          return 0;
        }
        iVar6 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar6;
      }
      pcVar7 = ptr + 3;
      if ((long)end - (long)pcVar7 < 6) {
        return -1;
      }
      lVar11 = 0;
      while (pcVar7[lVar11] == (&big2_scanCdataSection_CDATA_LSQB)[lVar11]) {
        lVar11 = lVar11 + 1;
        if (lVar11 == 6) {
          *nextTokPtr = ptr + 9;
          return 8;
        }
      }
      puVar10 = (uint *)(pcVar7 + lVar11);
      goto LAB_004cf3cc;
    case 0x11:
      ppcVar13 = (char **)(ptr + 2);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      if (bVar3 < 0x16) {
        if (bVar3 == 5) {
          if ((long)end - (long)ppcVar13 < 2) {
            return -2;
          }
          iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
          lVar11 = 4;
          pcVar7 = extraout_RDX_15;
        }
        else if (bVar3 == 6) {
          if ((long)(end + -(long)ppcVar13) < 3) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,end,(char **)(end + -(long)ppcVar13));
          lVar11 = 5;
          pcVar7 = extraout_RDX_16;
        }
        else {
          if (bVar3 != 7) goto switchD_004ced51_caseD_8;
          if ((long)(end + -(long)ppcVar13) < 4) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,end,(char **)(end + -(long)ppcVar13));
          lVar11 = 6;
          pcVar7 = extraout_RDX_14;
        }
        if (iVar6 == 0) goto switchD_004ced51_caseD_8;
      }
      else {
        lVar11 = 3;
        if ((bVar3 != 0x16) && (bVar3 != 0x18)) goto switchD_004ced51_caseD_8;
      }
      ptr = ptr + lVar11;
      while( true ) {
        if (ptr == end) {
          return -1;
        }
        lVar11 = 1;
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
        case 5:
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          iVar6 = (*enc[2].isPublicId)(enc,ptr,pcVar7,(char **)&DAT_00000001);
          lVar11 = 2;
          pcVar7 = extraout_RDX_17;
          break;
        case 6:
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          iVar6 = (*enc[2].utf8Convert)
                            (enc,(char **)ptr,pcVar7,(char **)&DAT_00000001,(char *)in_R8);
          lVar11 = 3;
          pcVar7 = extraout_RDX_18;
          break;
        case 7:
          if ((long)end - (long)ptr < 4) {
            return -2;
          }
          iVar6 = (*enc[2].utf16Convert)
                            (enc,(char **)ptr,pcVar7,(unsigned_short **)&DAT_00000001,in_R8);
          lVar11 = 4;
          pcVar7 = extraout_RDX_19;
          break;
        default:
          goto switchD_004cebd9_caseD_0;
        case 9:
        case 10:
        case 0x15:
          goto switchD_004cf2d5_caseD_9;
        case 0xb:
          goto switchD_004cf2d5_caseD_b;
        case 0x16:
        case 0x17:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          goto switchD_004cf2d5_caseD_16;
        }
        if (iVar6 == 0) break;
switchD_004cf2d5_caseD_16:
        ptr = (char *)((long)ptr + lVar11);
      }
      goto switchD_004cebd9_caseD_0;
    case 0x16:
    case 0x18:
      lVar11 = 2;
      goto LAB_004ceee6;
    }
    if (iVar6 == 0) {
switchD_004ced51_caseD_8:
      *nextTokPtr = (char *)ppcVar13;
      return 0;
    }
LAB_004ceee6:
    ptr = ptr + lVar11;
    if (ptr == end) {
      return -1;
    }
    bVar4 = false;
LAB_004cef01:
    lVar11 = 1;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
    case 5:
      if ((long)end - (long)ptr < 2) {
        return -2;
      }
      iVar6 = (*enc[2].isPublicId)(enc,ptr,pcVar7,(char **)&DAT_00000001);
      lVar11 = 2;
      pcVar7 = extraout_RDX_08;
      break;
    case 6:
      if ((long)end - (long)ptr < 3) {
        return -2;
      }
      iVar6 = (*enc[2].utf8Convert)(enc,(char **)ptr,pcVar7,(char **)&DAT_00000001,(char *)in_R8);
      lVar11 = 3;
      pcVar7 = extraout_RDX_09;
      break;
    case 7:
      if ((long)end - (long)ptr < 4) {
        return -2;
      }
      iVar6 = (*enc[2].utf16Convert)(enc,(char **)ptr,pcVar7,(unsigned_short **)&DAT_00000001,in_R8)
      ;
      lVar11 = 4;
      pcVar7 = extraout_RDX_11;
      break;
    default:
      goto switchD_004cebd9_caseD_0;
    case 9:
    case 10:
    case 0x15:
      ppcVar13 = (char **)((long)ptr + 1);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      pcVar12 = end + ~(ulong)ptr;
      goto LAB_004cf1c0;
    case 0xb:
      goto switchD_004cf1e1_caseD_b;
    case 0x11:
      goto switchD_004cf1e1_caseD_11;
    case 0x16:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
      goto switchD_004cef28_caseD_16;
    case 0x17:
      if (bVar4) goto switchD_004cebd9_caseD_0;
      ppcVar13 = (char **)((long)ptr + 1);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      if (bVar3 < 0x16) {
        if (bVar3 == 5) {
          if ((long)end - (long)ppcVar13 < 2) {
            return -2;
          }
          iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
          lVar11 = 3;
          pcVar7 = extraout_RDX_12;
        }
        else if (bVar3 == 6) {
          if ((long)end - (long)ppcVar13 < 3) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,pcVar7,(char **)&DAT_00000001);
          lVar11 = 4;
          pcVar7 = extraout_RDX_13;
        }
        else {
          if (bVar3 != 7) goto switchD_004ced51_caseD_8;
          if ((long)end - (long)ppcVar13 < 4) {
            return -2;
          }
          iVar6 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,pcVar7,(char **)&DAT_00000001);
          lVar11 = 5;
          pcVar7 = extraout_RDX_10;
        }
        bVar4 = true;
        if (iVar6 != 0) goto switchD_004cef28_caseD_16;
        goto switchD_004ced51_caseD_8;
      }
      bVar4 = true;
      lVar11 = 2;
      if ((bVar3 != 0x16) && (bVar3 != 0x18)) goto switchD_004ced51_caseD_8;
      goto switchD_004cef28_caseD_16;
    }
    if (iVar6 == 0) break;
switchD_004cef28_caseD_16:
    ptr = (char *)((long)ptr + lVar11);
    if (ptr == end) {
      return -1;
    }
    goto LAB_004cef01;
  case 3:
    iVar6 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar6;
  case 4:
    pbVar1 = (byte *)(ptr + 1);
    if (pbVar1 == (byte *)end) {
      return -5;
    }
    if (*pbVar1 == 0x5d) {
      ptr = ptr + 2;
      if (ptr == end) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto joined_r0x004ced66;
  case 5:
    puVar10 = (uint *)(end + -(long)ptr);
    if ((long)puVar10 < 2) {
      return -2;
    }
    iVar6 = (*enc[3].scanners[2])(enc,ptr,end,(char **)puVar10);
    if (iVar6 == 0) {
      pcVar7 = extraout_RDX_00;
      pbVar1 = (byte *)(ptr + 2);
      goto joined_r0x004ced66;
    }
    break;
  case 6:
    puVar10 = (uint *)(end + -(long)ptr);
    if ((long)puVar10 < 3) {
      return -2;
    }
    iVar6 = (*enc[3].scanners[3])(enc,ptr,end,(char **)puVar10);
    if (iVar6 == 0) {
      pcVar7 = extraout_RDX;
      pbVar1 = (byte *)(ptr + 3);
      goto joined_r0x004ced66;
    }
    break;
  case 7:
    puVar10 = (uint *)(end + -(long)ptr);
    if ((long)puVar10 < 4) {
      return -2;
    }
    iVar6 = (*enc[3].literalScanners[0])(enc,ptr,end,(char **)puVar10);
    if (iVar6 == 0) {
      pcVar7 = extraout_RDX_01;
      pbVar1 = (byte *)(ptr + 4);
      goto joined_r0x004ced66;
    }
    break;
  case 9:
    if (ptr + 1 != end) {
      pcVar7 = ptr + 1;
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar7 = ptr + 2;
      }
      *nextTokPtr = pcVar7;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    puVar10 = (uint *)nextTokPtr;
    pbVar1 = (byte *)(ptr + 1);
joined_r0x004ced66:
    pbVar5 = pbVar1;
    if (pbVar5 == (byte *)end) {
      *nextTokPtr = (char *)pbVar5;
      return 6;
    }
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar5)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      pbVar1 = pbVar5 + 1;
      if (pbVar1 == (byte *)end) break;
      if (*pbVar1 != 0x5d) goto joined_r0x004ced66;
      puVar10 = (uint *)(pbVar5 + 2);
      if (puVar10 == (uint *)end) break;
      if (*(byte *)puVar10 == 0x3e) goto LAB_004cf3cc;
      goto joined_r0x004ced66;
    case 5:
      if ((1 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].scanners[2])(enc,(char *)pbVar5,pcVar7,(char **)puVar10), iVar6 == 0)) {
        pcVar7 = extraout_RDX_03;
        pbVar1 = pbVar5 + 2;
        goto joined_r0x004ced66;
      }
      break;
    case 6:
      if ((2 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].scanners[3])(enc,(char *)pbVar5,pcVar7,(char **)puVar10), iVar6 == 0)) {
        pcVar7 = extraout_RDX_02;
        pbVar1 = pbVar5 + 3;
        goto joined_r0x004ced66;
      }
      break;
    case 7:
      if ((3 < (long)end - (long)pbVar5) &&
         (iVar6 = (*enc[3].literalScanners[0])(enc,(char *)pbVar5,pcVar7,(char **)puVar10),
         iVar6 == 0)) {
        pcVar7 = extraout_RDX_04;
        pbVar1 = pbVar5 + 4;
        goto joined_r0x004ced66;
      }
      break;
    default:
      pbVar1 = pbVar5 + 1;
      goto joined_r0x004ced66;
    }
    *nextTokPtr = (char *)pbVar5;
    return 6;
  }
switchD_004cebd9_caseD_0:
  *nextTokPtr = ptr;
  return 0;
switchD_004cf2d5_caseD_9:
  do {
    ptr = (char *)((long)ptr + 1);
    if (ptr == end) {
      return -1;
    }
    bVar3 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  } while ((bVar3 - 9 < 2) || (bVar3 == 0x15));
  if (bVar3 == 0xb) {
switchD_004cf2d5_caseD_b:
    *nextTokPtr = (char *)((long)ptr + 1);
    return 5;
  }
  goto switchD_004cebd9_caseD_0;
LAB_004cf1c0:
  uVar9 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
  uVar8 = uVar9 - 5;
  if (uVar8 < 0x19) {
    ptr = (char *)ppcVar13;
    switch(uVar9) {
    case 5:
      if ((long)pcVar12 < 2) {
        return -2;
      }
      iVar6 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
      lVar11 = 3;
      break;
    case 6:
      if ((long)pcVar12 < 3) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[0])
                        (enc,(char *)ppcVar13,pcVar7,
                         (char **)((long)&switchD_004cf1e1::switchdataD_005c3d7c +
                                  (long)(int)(&switchD_004cf1e1::switchdataD_005c3d7c)[uVar8]));
      lVar11 = 4;
      break;
    case 7:
      if ((long)pcVar12 < 4) {
        return -2;
      }
      iVar6 = (*enc[3].scanners[1])
                        (enc,(char *)ppcVar13,pcVar7,
                         (char **)((long)&switchD_004cf1e1::switchdataD_005c3d7c +
                                  (long)(int)(&switchD_004cf1e1::switchdataD_005c3d7c)[uVar8]));
      lVar11 = 5;
      break;
    default:
      goto switchD_004ced51_caseD_8;
    case 9:
    case 10:
    case 0x15:
      goto switchD_004cf1e1_caseD_9;
    case 0xb:
      goto switchD_004cf1e1_caseD_b;
    case 0x11:
      goto switchD_004cf1e1_caseD_11;
    case 0x16:
    case 0x18:
      lVar11 = 2;
      goto LAB_004cf442;
    }
    if (iVar6 != 0) {
LAB_004cf442:
      iVar6 = normal_scanAtts(enc,(char *)((long)ppcVar13 + lVar11 + -1),end,nextTokPtr);
      return iVar6;
    }
  }
  goto switchD_004ced51_caseD_8;
switchD_004cf1e1_caseD_9:
  ppcVar13 = (char **)((long)ppcVar13 + 1);
  pcVar12 = pcVar12 + -1;
  if (ppcVar13 == (char **)end) {
    return -1;
  }
  goto LAB_004cf1c0;
switchD_004cf1e1_caseD_b:
  *nextTokPtr = (char *)((long)ptr + 1);
  return 2;
switchD_004cf1e1_caseD_11:
  puVar10 = (uint *)((long)ptr + 1);
  if (puVar10 == (uint *)end) {
    return -1;
  }
  if (*(byte *)puVar10 == 0x3e) {
    *nextTokPtr = (char *)((long)ptr + 2);
    return 4;
  }
LAB_004cf3cc:
  *nextTokPtr = (char *)puVar10;
  return 0;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}